

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive-list.h
# Opt level: O2

void __thiscall
wabt::intrusive_list<wabt::Expr>::intrusive_list
          (intrusive_list<wabt::Expr> *this,
          unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *node)

{
  _Head_base<0UL,_wabt::Expr_*,_false> local_10;
  
  this->size_ = 0;
  this->first_ = (Expr *)0x0;
  this->last_ = (Expr *)0x0;
  local_10._M_head_impl =
       (node->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
       super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
       super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
  (node->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
  super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
  super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = (Expr *)0x0;
  push_back(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_10);
  if (local_10._M_head_impl != (Expr *)0x0) {
    (*(local_10._M_head_impl)->_vptr_Expr[1])();
  }
  return;
}

Assistant:

inline intrusive_list<T>::intrusive_list(std::unique_ptr<T> node) {
  push_back(std::move(node));
}